

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O0

void __thiscall
rest_rpc::rpc_service::connection::response_interal
          (connection *this,uint64_t req_id,
          shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *data,request_type req_type)

{
  size_type sVar1;
  message_type *in_RDX;
  void *__buf;
  int __fd;
  size_t in_RSI;
  connection *in_RDI;
  undefined1 local_40 [64];
  
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_RDI,
               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_RDX);
  __fd = (int)local_40;
  std::deque<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>::
  emplace_back<rest_rpc::message_type>
            ((deque<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_> *)in_RDI,in_RDX
            );
  message_type::~message_type((message_type *)0x287ca0);
  sVar1 = std::deque<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>::size
                    ((deque<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_> *)
                     0x287cb1);
  if (sVar1 < 2) {
    write(in_RDI,__fd,__buf,in_RSI);
  }
  return;
}

Assistant:

void response_interal(uint64_t req_id, std::shared_ptr<std::string> data,
                        request_type req_type = request_type::req_res) {
    assert(data->size() < MAX_BUF_LEN);

    write_queue_.emplace_back(message_type{req_id, req_type, std::move(data)});
    if (write_queue_.size() > 1) {
      return;
    }

    write();
  }